

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void __thiscall JHThread::Thread::Thread(Thread *this,pthread_t thread,char *name)

{
  this->_vptr_Thread = (_func_int **)&PTR__Thread_001309b0;
  this->mJoined = false;
  this->mSystemThread = true;
  if (name == (char *)0x0) {
    snprintf(this->mName,0x20,"t0x%lx",thread);
  }
  else {
    strncpy(this->mName,name,0x20);
    this->mName[0x1f] = '\0';
  }
  this->mSystemThread = true;
  pthread_setspecific(mThreadKey,this);
  return;
}

Assistant:

Thread::Thread( pthread_t thread, const char *name ) : mJoined( false ),
	mSystemThread( true )
{
	if ( name == NULL )
		snprintf( mName, kThreadNameLen, "t0x%lx", thread );
	else
	{
		strncpy( mName, name, kThreadNameLen );
		mName[ kThreadNameLen - 1 ] = '\0';
	}
	
	mSystemThread = true;
	
	pthread_setspecific( mThreadKey, this );	
}